

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall R2Rect::AddRect(R2Rect *this,R2Rect *other)

{
  VType *pVVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  VType VVar5;
  
  dVar2 = other->bounds_[0].bounds_.c_[0];
  pVVar1 = other->bounds_[0].bounds_.c_ + 1;
  if (dVar2 < *pVVar1 || dVar2 == *pVVar1) {
    dVar3 = this->bounds_[0].bounds_.c_[0];
    dVar4 = this->bounds_[0].bounds_.c_[1];
    if (dVar3 <= dVar4) {
      if (dVar2 < dVar3) {
        this->bounds_[0].bounds_.c_[0] = dVar2;
      }
      dVar2 = other->bounds_[0].bounds_.c_[1];
      if (dVar4 < dVar2) {
        this->bounds_[0].bounds_.c_[1] = dVar2;
      }
    }
    else {
      VVar5 = other->bounds_[0].bounds_.c_[1];
      this->bounds_[0].bounds_.c_[0] = other->bounds_[0].bounds_.c_[0];
      this->bounds_[0].bounds_.c_[1] = VVar5;
    }
  }
  dVar2 = other->bounds_[1].bounds_.c_[0];
  pVVar1 = other->bounds_[1].bounds_.c_ + 1;
  if (dVar2 < *pVVar1 || dVar2 == *pVVar1) {
    dVar3 = this->bounds_[1].bounds_.c_[0];
    dVar4 = this->bounds_[1].bounds_.c_[1];
    if (dVar4 < dVar3) {
      VVar5 = other->bounds_[1].bounds_.c_[1];
      this->bounds_[1].bounds_.c_[0] = other->bounds_[1].bounds_.c_[0];
      this->bounds_[1].bounds_.c_[1] = VVar5;
      return;
    }
    if (dVar2 < dVar3) {
      this->bounds_[1].bounds_.c_[0] = dVar2;
    }
    dVar2 = other->bounds_[1].bounds_.c_[1];
    if (dVar4 < dVar2) {
      this->bounds_[1].bounds_.c_[1] = dVar2;
      return;
    }
  }
  return;
}

Assistant:

T operator[](int b) const {
    S2_DCHECK_GE(b, 0);
    S2_DCHECK_LT(b, SIZE);
    return static_cast<const D&>(*this).Data()[b];
  }